

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clustergraph.h
# Opt level: O2

ostream * libDAI::operator<<(ostream *os,ClusterGraph *cl)

{
  VarSet *ns;
  ostream *os_00;
  long lVar1;
  long lVar2;
  
  std::operator<<(os,"{");
  ns = (cl->super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>)._V2.
       super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>._M_impl.
       super__Vector_impl_data._M_start;
  if ((cl->super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>)._V2.
      super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>._M_impl.
      super__Vector_impl_data._M_finish != ns) {
    operator<<(os,ns);
  }
  lVar1 = 0;
  for (lVar2 = 0;
      lVar2 != (long)(cl->super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>)._V2.
                     super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(cl->super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>)._V2.
                     super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>._M_impl.
                     super__Vector_impl_data._M_start >> 5; lVar2 = lVar2 + 1) {
    os_00 = std::operator<<(os,", ");
    operator<<(os_00,(VarSet *)
                     ((long)&(((cl->super_BipartiteGraph<libDAI::Var,_libDAI::VarSet>)._V2.
                               super__Vector_base<libDAI::VarSet,_std::allocator<libDAI::VarSet>_>.
                               _M_impl.super__Vector_impl_data._M_start)->_vars).
                             super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl +
                     lVar1));
    lVar1 = lVar1 + 0x20;
  }
  std::operator<<(os,"}");
  return os;
}

Assistant:

std::ostream & operator << ( std::ostream & os, const ClusterGraph & cl ) {
                //os << "<" << cl.nr1() << " vars, " << cl.nr2() << " clusters, " << cl.nr_edges() << " edges>: {";
                os << "{";
                size_t I = 0;
                if( I != cl.nr2() )
                    os << cl.V2(I);
                for( ; I != cl.nr2(); I++ )
                    os << ", " << cl.V2(I);
                os << "}";
                return os;
            }